

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanInstance.cpp
# Opt level: O0

bool __thiscall
VulkanUtilities::VulkanInstance::IsExtensionEnabled(VulkanInstance *this,char *ExtensionName)

{
  bool bVar1;
  int iVar2;
  reference ppcVar3;
  char **Extension;
  const_iterator __end1;
  const_iterator __begin1;
  vector<const_char_*,_std::allocator<const_char_*>_> *__range1;
  char *ExtensionName_local;
  VulkanInstance *this_local;
  
  __end1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::begin
                     (&this->m_EnabledExtensions);
  Extension = (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::end
                                 (&this->m_EnabledExtensions);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                *)&Extension);
    if (!bVar1) {
      return false;
    }
    ppcVar3 = __gnu_cxx::
              __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
              ::operator*(&__end1);
    iVar2 = strcmp(*ppcVar3,ExtensionName);
    if (iVar2 == 0) break;
    __gnu_cxx::
    __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
    ::operator++(&__end1);
  }
  return true;
}

Assistant:

bool VulkanInstance::IsExtensionEnabled(const char* ExtensionName) const
{
    for (const auto& Extension : m_EnabledExtensions)
        if (strcmp(Extension, ExtensionName) == 0)
            return true;

    return false;
}